

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O2

void __thiscall
Assimp::LWO::AnimResolver::DoInterpolation2
          (AnimResolver *this,const_iterator beg,const_iterator end,double time,float *fill)

{
  float fVar1;
  double dVar2;
  
  if ((end._M_current)->inter == IT_STEP) {
    fVar1 = (beg._M_current)->value;
  }
  else {
    dVar2 = (end._M_current)->time - (beg._M_current)->time;
    fVar1 = (beg._M_current)->value;
    if (0.0 < dVar2) {
      fVar1 = fVar1 + (float)((time - (beg._M_current)->time) / dVar2) *
                      ((end._M_current)->value - fVar1);
    }
  }
  *fill = fVar1;
  return;
}

Assistant:

void AnimResolver::DoInterpolation2(std::vector<LWO::Key>::const_iterator beg,
    std::vector<LWO::Key>::const_iterator end,double time, float& fill)
{
    switch ((*end).inter) {

        case LWO::IT_STEP:
            // no interpolation at all - take the value of the last key
            fill = (*beg).value;
            return;
        default:

            // silence compiler warning
            break;
    }
    // linear interpolation - default
    double duration = (*end).time - (*beg).time;
    if (duration > 0.0) {
        fill = (*beg).value + ((*end).value - (*beg).value)*(float)(((time - (*beg).time) / duration));
    } else {
        fill = (*beg).value;
    }
}